

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsRecover(octet *s,size_t count,size_t len,octet *si,octet *m0,octet *mi)

{
  size_t m;
  u64 *dest;
  word *d;
  word *da;
  word *db;
  u64 *dest_00;
  word *c;
  word *stack;
  long lVar1;
  long lVar2;
  bool_t bVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  u64 *dest_01;
  ulong uVar13;
  octet *src;
  size_t n;
  err_t eVar14;
  size_t sVar15;
  ulong n_00;
  ulong uVar16;
  long lVar17;
  ulong n_01;
  long lVar18;
  word *b;
  bool bVar19;
  octet *local_e8;
  long local_48;
  
  eVar14 = 0x6d;
  if ((count != 0) && (len == 0x20 || (len & 0xfffffffffffffff7) == 0x10)) {
    bVar3 = memIsValid(si,len * count);
    if (bVar3 != 0) {
      bVar3 = memIsValid(m0,len);
      if (bVar3 != 0) {
        bVar3 = memIsValid(mi,len * count);
        if (bVar3 != 0) {
          bVar3 = memIsValid(s,len);
          if (bVar3 != 0) {
            n_00 = len >> 3;
            sVar5 = ppMul_deep(n_00,n_00);
            n = n_00 * count;
            m = n_00 + 1;
            sVar6 = ppMod_deep(n,m);
            sVar7 = utilMax(2,sVar5,sVar6);
            n_01 = len >> 2;
            sVar5 = n_00 * 3;
            sVar15 = n_01 | 1;
            uVar13 = n_00;
            uVar16 = n_01;
            sVar6 = count;
            while (sVar6 = sVar6 - 1, sVar6 != 0) {
              sVar8 = ppExGCD_deep(m,uVar13 + 1);
              sVar9 = ppMul_deep(uVar13,uVar13);
              sVar10 = ppMul_deep(uVar16,n_00);
              sVar11 = ppMul_deep(n_01,uVar13);
              sVar12 = ppMod_deep(sVar5,sVar15);
              sVar7 = utilMax(6,sVar7,sVar8,sVar9,sVar10,sVar11,sVar12);
              sVar5 = sVar5 + n_01;
              uVar16 = uVar16 + n_01;
              uVar13 = uVar13 + n_00;
              sVar15 = sVar15 + n_00;
            }
            local_48 = count - 1;
            lVar18 = n_00 * local_48;
            lVar17 = (count * 2 + -1) * n_00;
            uVar16 = (count * 2 + -2) * n_00;
            uVar13 = (count + 1) * n_00;
            if (uVar13 <= uVar16 && uVar16 - uVar13 != 0) {
              uVar13 = uVar16;
            }
            dest_01 = (u64 *)blobCreate(sVar7 + lVar18 * 0x10 + (n_00 + n + m + lVar17 + uVar13) * 8
                                        + 0x20);
            if (dest_01 == (u64 *)0x0) {
              eVar14 = 0x6e;
            }
            else {
              dest = (u64 *)((long)dest_01 + len + 8);
              lVar1 = n * 8 + len + 8;
              d = (word *)((long)dest_01 + n * 8 + len + 0x10);
              lVar2 = lVar18 * 8 + lVar1 + 8;
              da = (word *)((long)dest_01 + lVar18 * 8 + lVar1 + 0x10);
              lVar1 = lVar18 * 8 + lVar2 + 8;
              db = (word *)((long)dest_01 + lVar18 * 8 + lVar2 + 0x10);
              lVar18 = len + 8 + lVar1;
              dest_00 = (u64 *)((long)dest_01 + len + 0x10 + lVar1);
              c = (word *)((long)dest_01 + lVar17 * 8 + lVar18 + 8);
              stack = c + uVar13;
              u64From(dest_00,si,len);
              u64From(dest,mi,len);
              *(undefined8 *)((long)dest_01 + len * 2 + 8) = 1;
              *(undefined8 *)((long)dest_01 + len) = 1;
              lVar17 = n_00 * 2;
              local_e8 = si + len;
              src = mi + len;
              b = (word *)((long)dest_01 + (count * 0x28 + -0x10) * n_00 + len * 2 + 0x28);
              sVar5 = 0;
              sVar6 = 0;
              while( true ) {
                bVar19 = local_48 == 0;
                local_48 = local_48 + -1;
                if (bVar19) break;
                u64From(dest_01,src,len);
                sVar7 = n_00 + sVar6 + 1;
                ppExGCD(d,da,db,dest_01,m,dest,sVar7,stack);
                iVar4 = wwCmpW(d,sVar7,1);
                if (iVar4 != 0) {
                  eVar14 = 0x1f9;
                  goto LAB_00117271;
                }
                sVar7 = n_00 + sVar6;
                ppMul(c,da,sVar7,dest_00,sVar7,stack);
                sVar15 = lVar17 + sVar5;
                ppMul(dest_00,c,sVar15,dest_01,n_00,stack);
                wwXor2((word *)((long)dest_01 + len + 8 + lVar18),c,sVar15);
                u64From(c,local_e8,len);
                ppMul(d,db,n_00,c,n_00,stack);
                ppMul(c,d,n_01,dest,sVar7,stack);
                wwXor2(b,d,n_01);
                wwXor2(dest_00,c,n_00 * 3 + sVar6);
                ppMul(c,dest_01,n_00,dest,sVar7,stack);
                wwXor2((word *)((long)c + len),dest,sVar7);
                wwXor2(b,dest_01,n_00);
                wwCopy(dest,c,sVar6 + lVar17);
                *(undefined8 *)((long)dest_01 + sVar6 * 8 + n_00 * 0x10 + len + 8) = 1;
                ppMod(dest_00,dest_00,sVar5 + n_00 * 3,dest,sVar6 + lVar17 + 1,stack);
                local_e8 = local_e8 + len;
                src = src + len;
                b = b + n_00;
                sVar5 = sVar15;
                sVar6 = sVar7;
              }
              u64From(dest_01,m0,len);
              *(undefined8 *)((long)dest_01 + len) = 1;
              ppMod(dest_00,dest_00,n,dest_01,m,stack);
              u64To(s,len,dest_00);
              eVar14 = 0;
LAB_00117271:
              blobClose(dest_01);
            }
          }
        }
      }
    }
  }
  return eVar14;
}

Assistant:

err_t belsRecover(octet s[], size_t count, size_t len, const octet si[], 
	const octet m0[], const octet mi[])
{
	size_t n, i, deep;
	void* state;
	word* f;
	word* g;
	word* d;
	word* u;
	word* v;
	word* c;
	word* t;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || count == 0 || 
		!memIsValid(si, count * len) || !memIsValid(m0, len) || 
		!memIsValid(mi, len * count) || !memIsValid(s, len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// расчет глубины стека
	n = W_OF_O(len);
	deep = utilMax(2, 
		ppMul_deep(n, n), 
		ppMod_deep(count * n, n + 1));
	for (i = 1; i < count; ++i)
		deep = utilMax(6, 
			deep, 
			ppExGCD_deep(n + 1, i * n + 1),
			ppMul_deep(i * n, i * n),
			ppMul_deep(2 * i * n, n),
			ppMul_deep(2 * n, i * n),
			ppMod_deep((2 * i + 1) * n, (i + 1) * n + 1));
	deep += O_OF_W(
		n + 1 +			
		count * n + 1 +
		(count - 1) * n + 1 +
		(count - 1) * n + 1 +
		n + 1 +
		(2 * count - 1) * n + 
		MAX2((2 * count - 2) * n, (count + 1) * n));
	// создать состояние
	state = blobCreate(deep);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	g = f + n + 1;
	d = g + count * n + 1;
	u = d + (count - 1) * n + 1;
	v = u + (count - 1) * n + 1;
	c = v + n + 1;
	t = c + (2 * count - 1) * n;
	stack = t + MAX2((2 * count - 2) * n, (count + 1) * n);
	// [n]c(x) <- s1(x)
	wwFrom(c, si, len);
	// [n + 1]g(x) <- x^l + m1(x)
	wwFrom(g, mi, len), g[n] = 1;
	// цикл по пользователям
	for (f[n] = 1, i = 1; i < count; ++i)
	{
		// [n + 1]f(x) <- x^l + mi(x)
		wwFrom(f, mi + i * len, len);
		// найти d(x) = \gcd(f(x), g(x)) и коэфф. Безу [i * n]u(x), [n]v(x)
		ppExGCD(d, u, v, f, n + 1, g, i * n + 1, stack);
		ASSERT(u[i * n] == 0 && v[n] == 0);
		// d(x) != 1? 
		if (wwCmpW(d, i * n + 1, 1) != 0)
		{
			blobClose(state);
			return ERR_BAD_PUBKEY;
		}
		// [2 * i * n]c(x) <- u(x)f(x)c(x)
		// (с помощью [2 * i * n]t)
		ppMul(t, u, i * n, c, i * n, stack);
		ppMul(c, t, 2 * i * n, f, n, stack);
		wwXor2(c + n, t, 2 * i * n);
		// c(x) <- c(x) + v(x)g(x)si(x)
		// (с помощью [2 * n]d и [(i + 2) * n]t)
		wwFrom(t, si + i * len, len);
		ppMul(d, v, n, t, n, stack);
		ppMul(t, d, 2 * n, g, i * n, stack);
		wwXor2(t + i * n, d, 2 * n);
		wwXor2(c, t, (i + 2) * n);
		// [(i + 1) * n + 1]g(x) <- g(x)f(x)
		// (с помощью [(i + 1) * n]t)
		ppMul(t, f, n, g, i * n, stack);
		wwXor2(t + n, g, i * n);
		wwXor2(t + i * n, f, n);
		wwCopy(g, t, (i + 1) * n);
		g[(i + 1) * n] = 1;
		// [(i + 1) * n]c(x) <- c(x) mod g(x)
		ppMod(c, c, (2 * i + 1) * n, g, (i + 1) * n + 1, stack);
		ASSERT(c[(i + 1) * n] == 0);
	}
	// [n]s(x) <- c(x) mod (x^l + m0(x))
	wwFrom(f, m0, len), f[n] = 1;
	ppMod(c, c, count * n, f, n + 1, stack);
	ASSERT(c[n] == 0);
	wwTo(s, len, c);
	// завершение
	blobClose(state);
	return ERR_OK;
}